

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

void __thiscall Color::upgrade(Color *this)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = this->_value;
  if ((uVar2 & 0xa0000000) != 0) {
    return;
  }
  if (((uint)uVar2 >> 0x1b & 1) != 0) {
    this->_value = (ulong)(((uint)uVar2 & 0xff) - 1 & 0xf7ffffff) | uVar2 & 0xffffffff5fffff00;
  }
  uVar3 = (uint)this->_value;
  if ((uVar3 >> 0x1c & 1) != 0) {
    iVar4 = 0x700;
    if ((uVar3 >> 0x18 & 1) == 0) {
      iVar4 = -0x100;
    }
    this->_value = (ulong)(iVar4 + (uVar3 & 0xff00) & 0xefffff00) |
                   this->_value & 0xfffffffffeff00ff;
  }
  pbVar1 = (byte *)((long)&this->_value + 3);
  *pbVar1 = *pbVar1 | 0x20;
  return;
}

Assistant:

void Color::upgrade ()
{
  if ((_value & _COLOR_256) ||
      (_value & _COLOR_24BIT)) return;

  if (_value & _COLOR_HASFG)
  {
    unsigned int fg = _value & _COLOR_FG;
    _value &= ~_COLOR_FG;
    _value |= fg - 1;
  }

  if (_value & _COLOR_HASBG)
  {
    bool bright = _value & _COLOR_BRIGHT;
    unsigned int bg = (_value & _COLOR_BG) >> 8;
    _value &= ~_COLOR_BG;
    _value &= ~_COLOR_BRIGHT;
    _value |= (bright ? bg + 7 : bg - 1) << 8;
  }

  _value |= _COLOR_256;
}